

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChIterativeSolverVI.cpp
# Opt level: O2

void __thiscall
chrono::ChIterativeSolverVI::ArchiveIN(ChIterativeSolverVI *this,ChArchiveIn *marchive)

{
  ChNameValue<double> local_90;
  ChNameValue<double> local_78;
  ChNameValue<double> local_60;
  ChNameValue<bool> local_48;
  ChNameValue<int> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChIterativeSolverVI>(marchive);
  ChSolver::ArchiveIN(&(this->super_ChSolverVI).super_ChSolver,marchive);
  local_30._value = &(this->super_ChIterativeSolver).m_max_iterations;
  local_30._name = "m_max_iterations";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &(this->super_ChIterativeSolver).m_warm_start;
  local_48._name = "m_warm_start";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  local_60._value = &(this->super_ChIterativeSolver).m_tolerance;
  local_60._name = "m_tolerance";
  local_60._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_60);
  local_78._value = &this->m_omega;
  local_78._name = "m_omega";
  local_78._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_78);
  local_90._value = &this->m_shlambda;
  local_90._name = "m_shlambda";
  local_90._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_90);
  return;
}

Assistant:

void ChIterativeSolverVI::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChIterativeSolverVI>();
    // deserialize parent class
    ChSolver::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(m_max_iterations);
    marchive >> CHNVP(m_warm_start);
    marchive >> CHNVP(m_tolerance);
    marchive >> CHNVP(m_omega);
    marchive >> CHNVP(m_shlambda);
}